

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.c
# Opt level: O3

void test_close(void)

{
  size_t *num_datagrams_00;
  quicly_state_t qVar1;
  bool bVar2;
  long lVar3;
  uint64_t uVar4;
  int iVar5;
  int64_t iVar6;
  undefined1 *buf;
  bool bVar7;
  uint64_t auStack_150 [3];
  undefined1 auStack_138 [8];
  undefined1 local_130 [8];
  quicly_decoded_packet_t decoded;
  quicly_closed_by_remote_t closed_by_remote;
  quicly_address_t dest;
  quicly_address_t src;
  size_t num_datagrams;
  quicly_closed_by_remote_t *local_58;
  uint64_t local_50;
  int64_t local_48;
  undefined1 local_40 [8];
  iovec datagram;
  
  uVar4 = quic_ctx.transport_params.max_udp_payload_size;
  num_datagrams = (size_t)auStack_138;
  decoded._128_8_ = test_closed_by_remote;
  local_58 = quic_ctx.closed_by_remote;
  lVar3 = -(quic_ctx.transport_params.max_udp_payload_size + 0xf & 0xfffffffffffffff0);
  buf = auStack_138 + lVar3;
  *(undefined8 *)((long)auStack_150 + lVar3 + 0x10) = 0x12077a;
  quic_ctx.closed_by_remote = (quicly_closed_by_remote_t *)&decoded._is_stateless_reset_cached;
  iVar5 = quicly_close(client,0x33039,"good bye");
  *(undefined8 *)((long)auStack_150 + lVar3 + 0x10) = 0x1207a2;
  _ok((uint)(iVar5 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
      0x1e7);
  qVar1 = (client->super).state;
  *(undefined8 *)((long)auStack_150 + lVar3 + 0x10) = 0x1207c5;
  _ok((uint)(qVar1 == QUICLY_STATE_CLOSING),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
      0x1e8);
  *(undefined8 *)((long)auStack_150 + lVar3 + 0x10) = 0x1207d1;
  iVar6 = quicly_get_first_timeout(client);
  *(undefined8 *)((long)auStack_150 + lVar3 + 0x10) = 0x1207f3;
  _ok((uint)(iVar6 <= quic_now),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
      0x1e9);
  src._20_8_ = 1;
  local_50 = uVar4;
  *(uint64_t *)((long)auStack_150 + lVar3 + 8) = uVar4;
  *(undefined8 *)((long)auStack_150 + lVar3) = 0x12082c;
  quicly_send(client,(quicly_address_t *)&closed_by_remote,
              (quicly_address_t *)((long)&dest.sin6.sin6_addr.__in6_u + 0xc),(iovec *)local_40,
              (size_t *)(src.sin6.sin6_addr.__in6_u.__u6_addr8 + 0xc),buf,
              *(size_t *)((long)auStack_150 + lVar3 + 8));
  if (src._20_8_ == 1) {
    *(undefined8 *)((long)auStack_150 + lVar3 + 0x10) = 0x120846;
    local_48 = quicly_get_first_timeout(client);
    bVar7 = quic_now < local_48;
    bVar2 = local_48 < quic_now + 1000;
    *(undefined8 *)((long)auStack_150 + lVar3 + 0x10) = 0x120890;
    _ok((uint)(bVar2 && bVar7),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
        0x1ee);
    *(undefined8 *)((long)auStack_150 + lVar3 + 0x10) = 0x1208a8;
    decode_packets((quicly_decoded_packet_t *)local_130,(iovec *)local_40,1);
    *(undefined8 *)((long)auStack_150 + lVar3 + 0x10) = 0x1208c0;
    iVar5 = quicly_receive(server,(sockaddr *)0x0,&fake_address.sa,
                           (quicly_decoded_packet_t *)local_130);
    *(undefined8 *)((long)auStack_150 + lVar3 + 0x10) = 0x1208da;
    _ok((uint)(iVar5 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
        500);
    *(undefined8 *)((long)auStack_150 + lVar3 + 0x10) = 0x1208fb;
    _ok((uint)(test_close_error_code == 0x3039),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
        0x1f5);
    qVar1 = (server->super).state;
    *(undefined8 *)((long)auStack_150 + lVar3 + 0x10) = 0x12091e;
    _ok((uint)(qVar1 == QUICLY_STATE_DRAINING),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
        0x1f6);
    *(undefined8 *)((long)auStack_150 + lVar3 + 0x10) = 0x12092a;
    iVar6 = quicly_get_first_timeout(server);
    *(undefined8 *)((long)auStack_150 + lVar3 + 0x10) = 0x12095e;
    _ok((uint)(iVar6 < quic_now + 1000 && quic_now < iVar6),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
        0x1f8);
    uVar4 = local_50;
    num_datagrams_00 = (size_t *)((long)&src + 0x14);
    src._20_8_ = 1;
    *(uint64_t *)((long)auStack_150 + lVar3 + 8) = local_50;
    *(undefined8 *)((long)auStack_150 + lVar3) = 0x120996;
    iVar5 = quicly_send(server,(quicly_address_t *)&closed_by_remote,
                        (quicly_address_t *)((long)&dest.sin6.sin6_addr.__in6_u + 0xc),
                        (iovec *)local_40,num_datagrams_00,buf,
                        *(size_t *)((long)auStack_150 + lVar3 + 8));
    *(undefined8 *)((long)auStack_150 + lVar3 + 0x10) = 0x1209b8;
    _ok((uint)(iVar5 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
        0x1fe);
    bVar7 = src._20_8_ == 0;
    *(undefined8 *)((long)auStack_150 + lVar3 + 0x10) = 0x1209da;
    _ok((uint)bVar7,"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
        0x1ff);
    quic_now = iVar6;
    if (iVar6 < local_48) {
      quic_now = local_48;
    }
    src._20_8_ = 1;
    *(uint64_t *)((long)auStack_150 + lVar3 + 8) = uVar4;
    *(undefined8 *)((long)auStack_150 + lVar3) = 0x120a1f;
    iVar5 = quicly_send(client,(quicly_address_t *)&closed_by_remote,
                        (quicly_address_t *)((long)&dest.sin6.sin6_addr.__in6_u + 0xc),
                        (iovec *)local_40,num_datagrams_00,buf,
                        *(size_t *)((long)auStack_150 + lVar3 + 8));
    *(undefined8 *)((long)auStack_150 + lVar3 + 0x10) = 0x120a49;
    _ok((uint)(iVar5 == 0xff03),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
        0x205);
    *(undefined8 *)((long)auStack_150 + lVar3 + 0x10) = 0x120a55;
    quicly_free(client);
    src._20_8_ = 1;
    *(uint64_t *)((long)auStack_150 + lVar3 + 8) = uVar4;
    *(undefined8 *)((long)auStack_150 + lVar3) = 0x120a85;
    iVar5 = quicly_send(server,(quicly_address_t *)&closed_by_remote,
                        (quicly_address_t *)((long)&dest.sin6.sin6_addr.__in6_u + 0xc),
                        (iovec *)local_40,num_datagrams_00,buf,
                        *(size_t *)((long)auStack_150 + lVar3 + 8));
    *(undefined8 *)((long)auStack_150 + lVar3 + 0x10) = 0x120aa8;
    _ok((uint)(iVar5 == 0xff03),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",
        0x209);
    *(undefined8 *)((long)auStack_150 + lVar3 + 0x10) = 0x120ab4;
    quicly_free(server);
    client = (quicly_conn_t *)0x0;
    server = (quicly_conn_t *)0x0;
    quic_ctx.closed_by_remote = local_58;
    return;
  }
  *(code **)((long)auStack_150 + lVar3 + 0x10) = tiny_connection_window;
  __assert_fail("num_datagrams == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c"
                ,0x1ec,"void test_close(void)");
}

Assistant:

static void test_close(void)
{
    quicly_closed_by_remote_t closed_by_remote = {test_closed_by_remote}, *orig_closed_by_remote = quic_ctx.closed_by_remote;
    quicly_address_t dest, src;
    struct iovec datagram;
    uint8_t datagram_buf[quic_ctx.transport_params.max_udp_payload_size];
    size_t num_datagrams;
    int64_t client_timeout, server_timeout;
    int ret;

    quic_ctx.closed_by_remote = &closed_by_remote;

    /* client sends close */
    ret = quicly_close(client, QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(12345), "good bye");
    ok(ret == 0);
    ok(quicly_get_state(client) == QUICLY_STATE_CLOSING);
    ok(quicly_get_first_timeout(client) <= quic_now);
    num_datagrams = 1;
    ret = quicly_send(client, &dest, &src, &datagram, &num_datagrams, datagram_buf, sizeof(datagram_buf));
    assert(num_datagrams == 1);
    client_timeout = quicly_get_first_timeout(client);
    ok(quic_now < client_timeout && client_timeout < quic_now + 1000); /* 3 pto or something */

    { /* server receives close */
        quicly_decoded_packet_t decoded;
        decode_packets(&decoded, &datagram, 1);
        ret = quicly_receive(server, NULL, &fake_address.sa, &decoded);
        ok(ret == 0);
        ok(test_close_error_code == 12345);
        ok(quicly_get_state(server) == QUICLY_STATE_DRAINING);
        server_timeout = quicly_get_first_timeout(server);
        ok(quic_now < server_timeout && server_timeout < quic_now + 1000); /* 3 pto or something */
    }

    /* nothing sent by the server in response */
    num_datagrams = 1;
    ret = quicly_send(server, &dest, &src, &datagram, &num_datagrams, datagram_buf, sizeof(datagram_buf));
    ok(ret == 0);
    ok(num_datagrams == 0);

    /* endpoints request discarding state after timeout */
    quic_now = client_timeout < server_timeout ? server_timeout : client_timeout;
    num_datagrams = 1;
    ret = quicly_send(client, &dest, &src, &datagram, &num_datagrams, datagram_buf, sizeof(datagram_buf));
    ok(ret == QUICLY_ERROR_FREE_CONNECTION);
    quicly_free(client);
    num_datagrams = 1;
    ret = quicly_send(server, &dest, &src, &datagram, &num_datagrams, datagram_buf, sizeof(datagram_buf));
    ok(ret == QUICLY_ERROR_FREE_CONNECTION);
    quicly_free(server);

    client = NULL;
    server = NULL;
    quic_ctx.closed_by_remote = orig_closed_by_remote;
}